

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  string *psVar2;
  uchar value;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  Message::Message((Message *)&local_60);
  uVar4 = 0;
  do {
    psVar2 = local_58;
    if (str->_M_string_length <= uVar4) {
      StringStreamToString(local_58,local_60._M_head_impl);
      if (local_60._M_head_impl != (stringstream *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
      return psVar2;
    }
    bVar1 = (str->_M_dataplus)._M_p[uVar4];
    if (bVar1 == 0x22) {
      if (!is_attribute) {
        std::operator<<((ostream *)(local_60._M_head_impl + 0x10),'\"');
        goto LAB_0010fd0d;
      }
      pcVar3 = "&quot;";
LAB_0010fd08:
      std::operator<<((ostream *)(local_60._M_head_impl + 0x10),pcVar3);
    }
    else {
      if (bVar1 == 0x26) {
        pcVar3 = "&amp;";
        goto LAB_0010fd08;
      }
      if (bVar1 != 0x27) {
        if (bVar1 == 0x3e) {
          pcVar3 = "&gt;";
        }
        else {
          if (bVar1 != 0x3c) {
            uVar5 = (uint)bVar1;
            if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0))))
            {
              if ((is_attribute) && ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)))) {
                std::operator<<((ostream *)(local_60._M_head_impl + 0x10),"&#x");
                String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)uVar5,value);
                std::operator<<((ostream *)(local_60._M_head_impl + 0x10),(string *)&local_50);
                std::operator<<((ostream *)(local_60._M_head_impl + 0x10),";");
                std::__cxx11::string::~string((string *)&local_50);
              }
              else {
                std::operator<<((ostream *)(local_60._M_head_impl + 0x10),bVar1);
              }
            }
            goto LAB_0010fd0d;
          }
          pcVar3 = "&lt;";
        }
        goto LAB_0010fd08;
      }
      if (is_attribute) {
        pcVar3 = "&apos;";
        goto LAB_0010fd08;
      }
      std::operator<<((ostream *)(local_60._M_head_impl + 0x10),'\'');
    }
LAB_0010fd0d:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}